

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall wasm::MultiMemoryLowering::Replacer::~Replacer(Replacer *this)

{
  Replacer *this_local;
  
  ~Replacer(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

Replacer(MultiMemoryLowering& parent, Module& wasm)
      : parent(parent), builder(wasm) {}